

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppLogger.cpp
# Opt level: O0

void __thiscall CppLogger::CppLogger::printError(CppLogger *this,string *t_Message)

{
  ostream *poVar1;
  string local_1f0 [48];
  string local_1c0 [32];
  undefined1 local_1a0 [8];
  stringstream formatted;
  string *t_Message_local;
  CppLogger *this_local;
  
  std::__cxx11::string::string(local_1c0,t_Message);
  printFormat((CppLogger *)local_1a0,(Level)this,(string *)0x4);
  std::__cxx11::string::~string(local_1c0);
  if ((this->m_Level != None) && ((int)this->m_Level < 5)) {
    poVar1 = std::operator<<(this->m_ErrorStream,(string *)&this->m_ErrorColor);
    std::__cxx11::stringstream::str();
    poVar1 = std::operator<<(poVar1,local_1f0);
    poVar1 = std::operator<<(poVar1,(string *)Color::reset_abi_cxx11_);
    std::ostream::operator<<((ostream *)poVar1,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_1f0);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1a0);
  return;
}

Assistant:

void CppLogger::printError(std::string t_Message) {
        std::stringstream formatted = printFormat(Level::Error, t_Message);
        if (m_Level != Level::None && m_Level <= Level::Error)
            *m_ErrorStream << m_ErrorColor << formatted.str() << Color::reset << std::endl;
    }